

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void av1_row_mt_sync_mem_dealloc(AV1EncRowMultiThreadSync *row_mt_sync)

{
  long *in_RDI;
  int i;
  undefined4 in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffff4;
  
  if (in_RDI != (long *)0x0) {
    if (*in_RDI != 0) {
      for (in_stack_fffffffffffffff4 = 0; in_stack_fffffffffffffff4 < (int)in_RDI[4];
          in_stack_fffffffffffffff4 = in_stack_fffffffffffffff4 + 1) {
        pthread_mutex_destroy((pthread_mutex_t *)(*in_RDI + (long)in_stack_fffffffffffffff4 * 0x28))
        ;
      }
      aom_free((void *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
    }
    if (in_RDI[1] != 0) {
      for (in_stack_fffffffffffffff4 = 0; in_stack_fffffffffffffff4 < (int)in_RDI[4];
          in_stack_fffffffffffffff4 = in_stack_fffffffffffffff4 + 1) {
        pthread_cond_destroy((pthread_cond_t *)(in_RDI[1] + (long)in_stack_fffffffffffffff4 * 0x30))
        ;
      }
      aom_free((void *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
    }
    aom_free((void *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
    memset(in_RDI,0,0x30);
  }
  return;
}

Assistant:

void av1_row_mt_sync_mem_dealloc(AV1EncRowMultiThreadSync *row_mt_sync) {
  if (row_mt_sync != NULL) {
#if CONFIG_MULTITHREAD
    int i;

    if (row_mt_sync->mutex_ != NULL) {
      for (i = 0; i < row_mt_sync->rows; ++i) {
        pthread_mutex_destroy(&row_mt_sync->mutex_[i]);
      }
      aom_free(row_mt_sync->mutex_);
    }
    if (row_mt_sync->cond_ != NULL) {
      for (i = 0; i < row_mt_sync->rows; ++i) {
        pthread_cond_destroy(&row_mt_sync->cond_[i]);
      }
      aom_free(row_mt_sync->cond_);
    }
#endif  // CONFIG_MULTITHREAD
    aom_free(row_mt_sync->num_finished_cols);

    // clear the structure as the source of this call may be dynamic change
    // in tiles in which case this call will be followed by an _alloc()
    // which may fail.
    av1_zero(*row_mt_sync);
  }
}